

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O1

int res(sunrealtype t,N_Vector yy,N_Vector yd,N_Vector resval,void *userdata)

{
  double dVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *pdVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double __x;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  dVar20 = *userdata;
  dVar21 = *(double *)((long)userdata + 8);
  dVar25 = *(double *)((long)userdata + 0x10);
  dVar1 = *(double *)((long)userdata + 0x18);
  uVar2 = *(undefined8 *)((long)userdata + 0x20);
  dVar3 = *(double *)((long)userdata + 0x28);
  dVar4 = *(double *)((long)userdata + 0x30);
  uVar5 = *(undefined8 *)((long)userdata + 0x38);
  uVar6 = *(undefined8 *)((long)userdata + 0x40);
  pdVar16 = *(double **)((long)yy->content + 0x10);
  dVar22 = *pdVar16;
  dVar23 = pdVar16[1];
  __x = pdVar16[1];
  dVar7 = pdVar16[2];
  dVar8 = pdVar16[3];
  dVar9 = pdVar16[4];
  dVar10 = pdVar16[5];
  pdVar17 = *(double **)((long)yd->content + 0x10);
  dVar11 = *pdVar17;
  dVar12 = pdVar17[1];
  dVar13 = pdVar17[2];
  dVar14 = pdVar17[3];
  dVar15 = pdVar17[4];
  dVar18 = (double)SUNRpowerI(*(undefined4 *)pdVar16,4);
  dVar19 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar19 = sqrt(__x);
    }
    else {
      dVar19 = SQRT(__x);
    }
  }
  dVar24 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar24 = sqrt(__x);
    }
    else {
      dVar24 = SQRT(__x);
    }
  }
  dVar24 = dVar1 * dVar10 * dVar10 * dVar24;
  auVar26._8_8_ = dVar21;
  auVar26._0_8_ = uVar5;
  auVar27._8_4_ = (int)uVar2;
  auVar27._0_8_ = uVar6;
  auVar27._12_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar27 = divpd(auVar26,auVar27);
  dVar19 = dVar19 * dVar18 * dVar20;
  dVar1 = dVar8 * dVar7 * dVar21;
  dVar25 = dVar25 * dVar22 * dVar8 * dVar8;
  dVar9 = dVar9 * auVar27._8_8_ * dVar22;
  pdVar16 = *(double **)((long)resval->content + 0x10);
  *pdVar16 = ((dVar19 + dVar19 + dVar11) - dVar1) + dVar9 + dVar25;
  pdVar16[1] = (dVar24 * 0.5 + dVar19 * 0.5 + dVar12 + dVar25) - dVar3 * (auVar27._0_8_ - dVar23);
  pdVar16[2] = ((dVar13 - dVar19) + dVar1) - dVar9;
  pdVar16[3] = dVar25 + dVar25 + ((dVar14 + dVar1) - dVar9);
  pdVar16[4] = ((dVar15 - dVar1) + dVar9) - dVar24;
  pdVar16[5] = dVar4 * dVar22 * dVar8 - dVar10;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yd, N_Vector resval,
               void* userdata)
{
  UserData data;
  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks, pCO2, H;

  sunrealtype y1, y2, y3, y4, y5, y6;
  sunrealtype yd1, yd2, yd3, yd4, yd5;

  sunrealtype r1, r2, r3, r4, r5, Fin;

  data = (UserData)userdata;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;
  pCO2 = data->pCO2;
  H    = data->H;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yd1 = Ith(yd, 1);
  yd2 = Ith(yd, 2);
  yd3 = Ith(yd, 3);
  yd4 = Ith(yd, 4);
  yd5 = Ith(yd, 5);

  r1  = k1 * SUNRpowerI(y1, 4) * SUNRsqrt(y2);
  r2  = k2 * y3 * y4;
  r3  = k2 / K * y1 * y5;
  r4  = k3 * y1 * y4 * y4;
  r5  = k4 * y6 * y6 * SUNRsqrt(y2);
  Fin = klA * (pCO2 / H - y2);

  Ith(resval, 1) = yd1 + TWO * r1 - r2 + r3 + r4;
  Ith(resval, 2) = yd2 + HALF * r1 + r4 + HALF * r5 - Fin;
  Ith(resval, 3) = yd3 - r1 + r2 - r3;
  Ith(resval, 4) = yd4 + r2 - r3 + TWO * r4;
  Ith(resval, 5) = yd5 - r2 + r3 - r5;
  Ith(resval, 6) = Ks * y1 * y4 - y6;

  return (0);
}